

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O2

void (anonymous_namespace)::DepGraphFormatter::
     Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>
               (VectorWriter *s,DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *depgraph)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  pointer pEVar4;
  long lVar5;
  pointer __first;
  pointer __last;
  uint uVar6;
  ulong uVar7;
  uint64_t uVar8;
  pointer puVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __i;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_00;
  uint uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  unsigned_long local_88;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> local_80;
  uint64_t diff;
  ClusterIndex idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rebuilt_order;
  vector<unsigned_int,_std::allocator<unsigned_int>_> topo_order;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&topo_order,
             ((long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(depgraph->entries).
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)&rebuilt_order);
  __last = topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = 0;
  for (puVar9 = topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 != topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
    *puVar9 = uVar6;
    uVar6 = uVar6 + 1;
  }
  if (topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar10 = (long)topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar7 = lVar10 >> 2;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                )depgraph);
    if (lVar10 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                           )depgraph);
    }
    else {
      __last_00._M_current = __first + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                  )depgraph);
      for (; __last_00._M_current != __last; __last_00._M_current = __last_00._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                  (__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                    )depgraph);
      }
    }
  }
  rebuilt_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rebuilt_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rebuilt_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&rebuilt_order,
             ((long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(depgraph->entries).
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  uVar12 = 0;
  uVar6 = 0xffffffff;
  do {
    uVar7 = (ulong)uVar12;
    if ((ulong)((long)topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar7) {
      ser_writedata8<VectorWriter>(s,'\0');
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&rebuilt_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    idx = topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7];
    diff = (uint64_t)
           &(depgraph->entries).
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start[idx].feerate.size;
    Wrapper<VarIntFormatter<(VarIntMode)1>,_const_int_&>::Serialize<VectorWriter>
              ((Wrapper<VarIntFormatter<(VarIntMode)1>,_const_int_&> *)&diff,s);
    uVar3 = (depgraph->entries).
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start[idx].feerate.fee;
    local_80.m_object = (unsigned_long *)(~uVar3 * 2 + 1);
    if (-1 < (long)uVar3) {
      local_80.m_object = (unsigned_long *)(uVar3 * 2);
    }
    diff = (uint64_t)&local_80;
    Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&>::Serialize<VectorWriter>
              ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)&diff,s);
    diff = 0;
    uVar8 = 0;
    uVar11 = 0;
    uVar13 = uVar6;
    while (bVar14 = uVar7 != 0, uVar7 = uVar7 - 1, bVar14) {
      uVar1 = topo_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
      pEVar4 = (depgraph->entries).
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pEVar4[uVar1].descendants.m_val & uVar11) == 0) {
        if ((pEVar4[idx].ancestors.m_val >> (uVar1 & 0x1f) & 1) == 0) {
          uVar8 = uVar8 + 1;
          diff = uVar8;
        }
        else {
          local_80.m_object = (unsigned_long *)&diff;
          Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&>::Serialize<VectorWriter>
                    (&local_80,s);
          diff = 0;
          uVar11 = uVar11 | 1 << ((byte)uVar1 & 0x1f);
          uVar8 = 0;
        }
      }
      uVar13 = uVar13 - 1;
    }
    uVar13 = 0;
    do {
      uVar7 = (ulong)uVar13;
      if ((ulong)((long)rebuilt_order.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)rebuilt_order.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar7) break;
      uVar13 = uVar13 + 1;
    } while (idx <= rebuilt_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1 - uVar7]);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
              (&rebuilt_order,
               (const_iterator)
               (rebuilt_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish + -uVar7),&idx);
    local_88 = uVar7 + diff;
    local_80.m_object = &local_88;
    Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&>::Serialize<VectorWriter>(&local_80,s);
    uVar12 = uVar12 + 1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static void Ser(Stream& s, const DepGraph<SetType>& depgraph)
    {
        /** Construct a topological order to serialize the transactions in. */
        std::vector<ClusterIndex> topo_order(depgraph.TxCount());
        std::iota(topo_order.begin(), topo_order.end(), ClusterIndex{0});
        std::sort(topo_order.begin(), topo_order.end(), [&](ClusterIndex a, ClusterIndex b) {
            auto anc_a = depgraph.Ancestors(a).Count(), anc_b = depgraph.Ancestors(b).Count();
            if (anc_a != anc_b) return anc_a < anc_b;
            return a < b;
        });

        /** Which transactions the deserializer already knows when it has deserialized what has
         *  been serialized here so far, and in what order. */
        std::vector<ClusterIndex> rebuilt_order;
        rebuilt_order.reserve(depgraph.TxCount());

        // Loop over the transactions in topological order.
        for (ClusterIndex topo_idx = 0; topo_idx < topo_order.size(); ++topo_idx) {
            /** Which depgraph index we are currently writing. */
            ClusterIndex idx = topo_order[topo_idx];
            // Write size, which must be larger than 0.
            s << VARINT_MODE(depgraph.FeeRate(idx).size, VarIntMode::NONNEGATIVE_SIGNED);
            // Write fee, encoded as an unsigned varint (odd=negative, even=non-negative).
            s << VARINT(SignedToUnsigned(depgraph.FeeRate(idx).fee));
            // Write dependency information.
            SetType written_parents;
            uint64_t diff = 0; //!< How many potential parent/child relations we have skipped over.
            for (ClusterIndex dep_dist = 0; dep_dist < topo_idx; ++dep_dist) {
                /** Which depgraph index we are currently considering as parent of idx. */
                ClusterIndex dep_idx = topo_order[topo_idx - 1 - dep_dist];
                // Ignore transactions which are already known to be ancestors.
                if (depgraph.Descendants(dep_idx).Overlaps(written_parents)) continue;
                if (depgraph.Ancestors(idx)[dep_idx]) {
                    // When an actual parent is encountered, encode how many non-parents were skipped
                    // before it.
                    s << VARINT(diff);
                    diff = 0;
                    written_parents.Set(dep_idx);
                } else {
                    // When a non-parent is encountered, increment the skip counter.
                    ++diff;
                }
            }
            // Write position information.
            ClusterIndex insert_distance = 0;
            while (insert_distance < rebuilt_order.size()) {
                // Loop to find how far from the end in rebuilt_order to insert.
                if (idx > *(rebuilt_order.end() - 1 - insert_distance)) break;
                ++insert_distance;
            }
            rebuilt_order.insert(rebuilt_order.end() - insert_distance, idx);
            s << VARINT(diff + insert_distance);
        }

        // Output a final 0 to denote the end of the graph.
        s << uint8_t{0};
    }